

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O1

void laplacian(qnode_ptr_t p)

{
  int iVar1;
  uint uVar2;
  image512_t *pafVar3;
  image512_t *pafVar4;
  int iVar5;
  qnode_ptr_t p_00;
  int iVar6;
  uint uVar7;
  kernel_t *pkVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  undefined8 auStack_828 [257];
  
  bVar12 = 0;
  iVar6 = p->res;
  iVar5 = p->sizx;
  iVar1 = p->sizy;
  p_00 = (qnode_ptr_t)malloc(0x40);
  p_00->res = iVar6;
  p_00->sizx = iVar5;
  p_00->sizy = iVar1;
  p_00->level = 0;
  alloc_lap(p_00);
  pafVar3 = p->lap_ptr;
  p_00->gauss_ptr = pafVar3;
  uVar2 = p_00->sizy;
  if (0 < (int)uVar2) {
    iVar1 = p_00->sizx;
    uVar7 = 0;
    do {
      if (0 < iVar1) {
        lVar11 = 0;
        do {
          if ((uVar7 & 1 & (uint)lVar11) == 0) {
            (*pafVar3)[(long)p_00->res * (long)(int)uVar7 + lVar11] = 0.0;
          }
          lVar11 = lVar11 + 1;
        } while (iVar1 != (int)lVar11);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  pkVar8 = &kerb;
  puVar9 = auStack_828;
  for (lVar11 = 0x101; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar9 = *(undefined8 *)pkVar8->k;
    pkVar8 = (kernel_t *)((long)pkVar8 + ((ulong)bVar12 * -2 + 1) * 8);
    puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
  }
  convolve(p_00);
  p->lap_ptr = p_00->lap_ptr;
  dealloc_gauss(p_00);
  free(p_00);
  iVar1 = p->sizy;
  if (0 < iVar1) {
    uVar2 = p->sizx;
    iVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar11 = (long)iVar6 * (long)p->res;
        pafVar3 = p->gauss_ptr;
        pafVar4 = p->lap_ptr;
        uVar10 = 0;
        do {
          (*pafVar4)[lVar11 + uVar10] = (*pafVar3)[lVar11 + uVar10] - (*pafVar4)[lVar11 + uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar1);
  }
  return;
}

Assistant:

void laplacian(p)
qnode_ptr_t p ;

{ extern kernel_t kerb ;
  qnode_ptr_t create_node(), q ;
  int i, j ;

  q = create_node(0,p->res,p->sizx,p->sizy) ;
  alloc_lap(q) ;
  q->gauss_ptr = p->lap_ptr ;
  for (i = 0 ; i < q->sizy ; i++) {
    for (j = 0 ; j < q->sizx ; j++) {
      if ((i%2 == 0) || (j%2 == 0)) {
        (*q->gauss_ptr)[q->res*i + j] = 0.0 ;
      }
    }
  }
  convolve(q,kerb) ;
  p->lap_ptr = q->lap_ptr ;
  dealloc_gauss(q) ;
  free(q) ;
  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      (*p->lap_ptr)[p->res*i + j] =
      (*p->gauss_ptr)[p->res*i + j] - (*p->lap_ptr)[p->res*i + j] ;
    }
  }
}